

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O2

bool __thiscall spvtools::opt::Instruction::IsVulkanUniformBuffer(Instruction *this)

{
  uint32_t uVar1;
  Op OVar2;
  DefUseManager *pDVar3;
  Instruction *this_00;
  DecorationManager *this_01;
  bool is_block;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  if (this->opcode_ == OpTypePointer) {
    uVar1 = GetSingleWordInOperand(this,0);
    if (uVar1 != 2) {
      return false;
    }
    pDVar3 = IRContext::get_def_use_mgr(this->context_);
    uVar1 = GetSingleWordInOperand(this,1);
    this_00 = analysis::DefUseManager::GetDef(pDVar3,uVar1);
    OVar2 = this_00->opcode_;
    if ((OVar2 & ~OpUndef) == OpTypeArray) {
      pDVar3 = IRContext::get_def_use_mgr(this->context_);
      uVar1 = GetSingleWordInOperand(this_00,0);
      this_00 = analysis::DefUseManager::GetDef(pDVar3,uVar1);
      OVar2 = this_00->opcode_;
    }
    if (OVar2 == OpTypeStruct) {
      is_block = false;
      this_01 = IRContext::get_decoration_mgr(this->context_);
      uVar1 = result_id(this_00);
      local_40._8_8_ = 0;
      local_28 = std::
                 _Function_handler<void_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.cpp:461:7)>
                 ::_M_invoke;
      local_30 = std::
                 _Function_handler<void_(const_spvtools::opt::Instruction_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.cpp:461:7)>
                 ::_M_manager;
      local_40._M_unused._M_object = &is_block;
      analysis::DecorationManager::ForEachDecoration
                (this_01,uVar1,2,(function<void_(const_spvtools::opt::Instruction_&)> *)&local_40);
      if (local_30 == (code *)0x0) {
        return is_block;
      }
      (*local_30)(&local_40,&local_40,__destroy_functor);
      return is_block;
    }
  }
  return false;
}

Assistant:

bool Instruction::IsVulkanUniformBuffer() const {
  if (opcode() != spv::Op::OpTypePointer) {
    return false;
  }

  spv::StorageClass storage_class =
      spv::StorageClass(GetSingleWordInOperand(kPointerTypeStorageClassIndex));
  if (storage_class != spv::StorageClass::Uniform) {
    return false;
  }

  Instruction* base_type =
      context()->get_def_use_mgr()->GetDef(GetSingleWordInOperand(1));

  // Unpack the optional layer of arraying.
  if (base_type->opcode() == spv::Op::OpTypeArray ||
      base_type->opcode() == spv::Op::OpTypeRuntimeArray) {
    base_type = context()->get_def_use_mgr()->GetDef(
        base_type->GetSingleWordInOperand(0));
  }

  if (base_type->opcode() != spv::Op::OpTypeStruct) {
    return false;
  }

  bool is_block = false;
  context()->get_decoration_mgr()->ForEachDecoration(
      base_type->result_id(), uint32_t(spv::Decoration::Block),
      [&is_block](const Instruction&) { is_block = true; });
  return is_block;
}